

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildReg1Unsigned1(IRBuilder *this,OpCode newOpcode,uint offset,RegSlot R0,int32 C1)

{
  RegSlot RVar1;
  JITTimeFunctionBody *this_00;
  Opnd *newSrc;
  StackSym *pSVar2;
  RegOpnd *pRVar3;
  Instr *pIVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a2;
  Instr *local_a0;
  Instr *instr;
  IntConstOpnd *srcOpnd;
  IntConstType value;
  StackSym *dstSym;
  RegOpnd *dstOpnd;
  Instr *instr_4;
  Instr *instr_3;
  RegOpnd *dstOpnd_3;
  Opnd *src2Opnd;
  RegOpnd *src1Opnd;
  Instr *instr_2;
  RegOpnd *dstOpnd_2;
  RegOpnd *srcOpnd_2;
  Instr *instr_1;
  RegOpnd *dstOpnd_1;
  RegOpnd *srcOpnd_1;
  int32 C1_local;
  RegSlot R0_local;
  uint offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  srcOpnd_1._0_4_ = C1;
  srcOpnd_1._4_4_ = R0;
  C1_local = offset;
  R0_local._2_2_ = newOpcode;
  _offset_local = this;
  if (newOpcode == LdInnerScope) {
    RVar1 = InnerScopeIndexToRegSlot(this,C1);
    dstOpnd_1 = BuildSrcOpnd(this,RVar1,TyVar);
    instr_1 = (Instr *)BuildDstOpnd(this,srcOpnd_1._4_4_,TyVar,false,false);
    srcOpnd_2 = (RegOpnd *)IR::Instr::New(Ld_A,(Opnd *)instr_1,&dstOpnd_1->super_Opnd,this->m_func);
    if (((ulong)instr_1->m_next->m_prev & 1) != 0) {
      *(uint *)&instr_1->m_next->m_prev = *(uint *)&instr_1->m_next->m_prev & 0xfffffffd | 2;
    }
    AddInstr(this,(Instr *)srcOpnd_2,C1_local);
  }
  else if (newOpcode == LdIndexedFrameDisplayNoParent) {
    R0_local._2_2_ = LdFrameDisplay;
    RVar1 = InnerScopeIndexToRegSlot(this,C1);
    dstOpnd_2 = BuildSrcOpnd(this,RVar1,TyVar);
    instr_2 = (Instr *)BuildDstOpnd(this,srcOpnd_1._4_4_,TyVar,false,false);
    src1Opnd = (RegOpnd *)
               IR::Instr::New(R0_local._2_2_,(Opnd *)instr_2,&dstOpnd_2->super_Opnd,this->m_func);
    AddEnvOpndForInnerFrameDisplay(this,(Instr *)src1Opnd,C1_local);
    if (((ulong)instr_2->m_next->m_prev & 1) != 0) {
      *(uint *)&instr_2->m_next->m_prev = *(uint *)&instr_2->m_next->m_prev & 0xfffffffd | 2;
    }
    AddInstr(this,(Instr *)src1Opnd,C1_local);
  }
  else if (newOpcode == GetCachedFunc) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    RVar1 = JITTimeFunctionBody::GetLocalClosureReg(this_00);
    src2Opnd = &BuildSrcOpnd(this,RVar1,TyVar)->super_Opnd;
    dstOpnd_3 = (RegOpnd *)
                IR::IntConstOpnd::New((long)(int)(uint)srcOpnd_1,TyUint32,this->m_func,false);
    instr_3 = (Instr *)BuildDstOpnd(this,srcOpnd_1._4_4_,TyVar,false,false);
    instr_4 = IR::Instr::New(R0_local._2_2_,(Opnd *)instr_3,src2Opnd,&dstOpnd_3->super_Opnd,
                             this->m_func);
    if (((ulong)instr_3->m_next->m_prev & 1) != 0) {
      *(uint *)&instr_3->m_next->m_prev = *(uint *)&instr_3->m_next->m_prev & 0xfffffffd | 2;
    }
    AddInstr(this,instr_4,C1_local);
  }
  else if (newOpcode == NewRegEx) {
    BuildRegexFromPattern(this,R0,C1,offset);
  }
  else if (newOpcode == InitForInEnumerator) {
    pIVar4 = IR::Instr::New(InitForInEnumerator,this->m_func);
    dstOpnd = (RegOpnd *)pIVar4;
    pRVar3 = BuildSrcOpnd(this,srcOpnd_1._4_4_,TyVar);
    IR::Instr::SetSrc1(pIVar4,&pRVar3->super_Opnd);
    pRVar3 = dstOpnd;
    newSrc = BuildForInEnumeratorOpnd(this,(uint)srcOpnd_1,C1_local);
    IR::Instr::SetSrc2((Instr *)pRVar3,newSrc);
    AddInstr(this,(Instr *)dstOpnd,C1_local);
  }
  else {
    dstSym = (StackSym *)BuildDstOpnd(this,R0,TyVar,false,false);
    value = *(IntConstType *)&(dstSym->super_Sym).m_id;
    srcOpnd = (IntConstOpnd *)(long)(int)(uint)srcOpnd_1;
    instr = (Instr *)IR::IntConstOpnd::New((IntConstType)srcOpnd,TyInt32,this->m_func,false);
    local_a0 = IR::Instr::New(R0_local._2_2_,(Opnd *)dstSym,(Opnd *)instr,this->m_func);
    AddInstr(this,local_a0,C1_local);
    if (R0_local._2_2_ == NewScopeSlots) {
      pSVar2 = Func::GetLocalClosureSym(this->m_func);
      pRVar3 = IR::RegOpnd::New(pSVar2,TyVar,this->m_func);
      pIVar4 = IR::Instr::New(Ld_A,&pRVar3->super_Opnd,(Opnd *)dstSym,this->m_func);
      AddInstr(this,pIVar4,0xffffffff);
    }
    pSVar2 = dstSym;
    if (((*(uint *)(value + 0x18) & 1) != 0) &&
       ((R0_local._2_2_ == NewScArray || (R0_local._2_2_ == NewScArrayWithMissingValues)))) {
      *(uint *)(value + 0x18) = *(uint *)(value + 0x18) & 0xfffffffb | 4;
      *(uint *)(value + 0x18) = *(uint *)(value + 0x18) & 0xfffffffd | 2;
    }
    if ((R0_local._2_2_ == NewScArray) || (R0_local._2_2_ == NewScArrayWithMissingValues)) {
      local_a6.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Array);
      local_a4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues
                     ((ValueType *)&local_a6.field_0,R0_local._2_2_ == NewScArray);
      local_a2.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)&local_a4.field_0,TypeIds_Array);
      IR::Opnd::SetValueType((Opnd *)pSVar2,(ValueType)local_a2.field_0);
      IR::Opnd::SetValueTypeFixed((Opnd *)dstSym);
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg1Unsigned1(Js::OpCode newOpcode, uint offset, Js::RegSlot R0, int32 C1)
{
    switch (newOpcode)
    {
        case Js::OpCode::NewRegEx:
            this->BuildRegexFromPattern(R0, C1, offset);
            return;

        case Js::OpCode::LdInnerScope:
        {
            IR::RegOpnd * srcOpnd = BuildSrcOpnd(this->InnerScopeIndexToRegSlot(C1));
            IR::RegOpnd * dstOpnd = BuildDstOpnd(R0);
            IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::LdIndexedFrameDisplayNoParent:
        {
            newOpcode = Js::OpCode::LdFrameDisplay;
            IR::RegOpnd *srcOpnd = this->BuildSrcOpnd(this->InnerScopeIndexToRegSlot(C1));
            IR::RegOpnd *dstOpnd = this->BuildDstOpnd(R0);
            IR::Instr *instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);
            this->AddEnvOpndForInnerFrameDisplay(instr, offset);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::GetCachedFunc:
        {
            IR::RegOpnd *src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());
            IR::Opnd *src2Opnd = IR::IntConstOpnd::New(C1, TyUint32, m_func);
            IR::RegOpnd *dstOpnd = this->BuildDstOpnd(R0);
            IR::Instr *instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::InitForInEnumerator:
        {
            IR::Instr *instr = IR::Instr::New(Js::OpCode::InitForInEnumerator, m_func);
            instr->SetSrc1(this->BuildSrcOpnd(R0));
            instr->SetSrc2(this->BuildForInEnumeratorOpnd(C1, offset));
            this->AddInstr(instr, offset);
            return;
        }
    }


    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(R0);

    StackSym *      dstSym = dstOpnd->m_sym;
    IntConstType    value = C1;
    IR::IntConstOpnd * srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    IR::Instr *     instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);

    this->AddInstr(instr, offset);

    if (newOpcode == Js::OpCode::NewScopeSlots)
    {
        this->AddInstr(
            IR::Instr::New(
                Js::OpCode::Ld_A, IR::RegOpnd::New(m_func->GetLocalClosureSym(), TyVar, m_func), dstOpnd, m_func),
            (uint32)-1);
    }

    if (dstSym->m_isSingleDef)
    {
        switch (newOpcode)
        {
        case Js::OpCode::NewScArray:
        case Js::OpCode::NewScArrayWithMissingValues:
            dstSym->m_isSafeThis = true;
            dstSym->m_isNotNumber = true;
            break;
        }
    }

    if (newOpcode == Js::OpCode::NewScArray || newOpcode == Js::OpCode::NewScArrayWithMissingValues)
    {
        // Undefined values in array literals ([0, undefined, 1]) are treated as missing values in some versions
        dstOpnd->SetValueType(
            ValueType::GetObject(ObjectType::Array)
                .SetHasNoMissingValues(newOpcode == Js::OpCode::NewScArray)
                .SetArrayTypeId(Js::TypeIds_Array));
        dstOpnd->SetValueTypeFixed();
    }
}